

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::StringTrieBuilder::writeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int32_t length_00;
  bool bVar12;
  char acStack_ce [2];
  UBool isFinal [4];
  long local_c8;
  int32_t aiStack_c0 [2];
  int32_t starts [5];
  int32_t jumpTargets [4];
  UChar middleUnits [14];
  int32_t lessThan [14];
  ulong uVar11;
  
  local_c8 = 0;
  aiStack_c0[1] = limit;
  for (; iVar2 = (*(this->super_UObject)._vptr_UObject[0xb])(this), iVar2 < length;
      length = length - length_00) {
    length_00 = (int32_t)((long)length / 2);
    uVar3 = (*(this->super_UObject)._vptr_UObject[8])
                      (this,(ulong)(uint)start,unitIndex,(long)length / 2 & 0xffffffff);
    iVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar3,unitIndex);
    middleUnits[local_c8] = (UChar)iVar2;
    iVar4 = writeBranchSubNode(this,start,uVar3,unitIndex,length_00);
    lessThan[local_c8] = iVar4;
    local_c8 = local_c8 + 1;
    start = uVar3;
  }
  iVar2 = unitIndex + 1;
  uVar3 = length - 1;
  lVar8 = 0;
  do {
    lVar9 = lVar8;
    starts[lVar9] = start;
    uVar5 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(uint)start,unitIndex);
    uVar5 = (*(this->super_UObject)._vptr_UObject[9])
                      (this,(ulong)(start + 1),unitIndex,(ulong)(uVar5 & 0xffff));
    if (start == uVar5 - 1) {
      iVar6 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(uint)start);
      bVar12 = iVar2 == iVar6;
    }
    else {
      bVar12 = false;
    }
    isFinal[lVar9] = bVar12;
    lVar8 = lVar9 + 1;
    start = uVar5;
  } while (lVar8 < (int)uVar3);
  starts[lVar8] = uVar5;
  lVar9 = lVar9 + 2;
  do {
    if (acStack_ce[lVar9] == '\0') {
      iVar4 = writeNode(this,aiStack_c0[lVar9],starts[lVar9 + -1],iVar2);
      jumpTargets[lVar9 + -2] = iVar4;
    }
    lVar9 = lVar9 + -1;
  } while (1 < lVar9);
  writeNode(this,uVar5,aiStack_c0[1],iVar2);
  uVar5 = (*(this->super_UObject)._vptr_UObject[4])
                    (this,(ulong)uVar5,CONCAT44(in_register_0000000c,unitIndex));
  iVar2 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar5 & 0xffff));
  uVar11 = (ulong)uVar3;
  for (; uVar10 = uVar11 - 1, 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar5 = starts[uVar10];
    cVar1 = acStack_ce[uVar11 + 1];
    if (cVar1 == '\0') {
      uVar7 = iVar2 - jumpTargets[uVar10];
    }
    else {
      uVar7 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)uVar5);
    }
    (*(this->super_UObject)._vptr_UObject[0x11])(this,(ulong)uVar7,(ulong)(uint)(int)cVar1);
    uVar5 = (*(this->super_UObject)._vptr_UObject[4])
                      (this,(ulong)uVar5,CONCAT44(in_register_0000000c,unitIndex));
    iVar2 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar5 & 0xffff));
    uVar11 = uVar10;
  }
  for (; 0 < local_c8; local_c8 = local_c8 + -1) {
    (*(this->super_UObject)._vptr_UObject[0x13])(this,(ulong)(uint)lessThan[local_c8 + -1]);
    iVar2 = (*(this->super_UObject)._vptr_UObject[0xf])
                      (this,(ulong)(ushort)middleUnits[local_c8 + -1]);
  }
  return iVar2;
}

Assistant:

int32_t
StringTrieBuilder::writeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex, int32_t length) {
    UChar middleUnits[kMaxSplitBranchLevels];
    int32_t lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Encode the less-than branch first.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=writeBranchSubNode(start, i, unitIndex, length/2);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t starts[kMaxBranchLinearSubNodeLength];
    UBool isFinal[kMaxBranchLinearSubNodeLength-1];
    int32_t unitNumber=0;
    do {
        int32_t i=starts[unitNumber]=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        isFinal[unitNumber]= start==i-1 && unitIndex+1==getElementStringLength(start);
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    starts[unitNumber]=start;

    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t jumpTargets[kMaxBranchLinearSubNodeLength-1];
    do {
        --unitNumber;
        if(!isFinal[unitNumber]) {
            jumpTargets[unitNumber]=writeNode(starts[unitNumber], starts[unitNumber+1], unitIndex+1);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    writeNode(start, limit, unitIndex+1);
    int32_t offset=write(getElementUnit(start, unitIndex));
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        start=starts[unitNumber];
        int32_t value;
        if(isFinal[unitNumber]) {
            // Write the final value for the one string ending with this unit.
            value=getElementValue(start);
        } else {
            // Write the delta to the start position of the sub-node.
            value=offset-jumpTargets[unitNumber];
        }
        writeValueAndFinal(value, isFinal[unitNumber]);
        offset=write(getElementUnit(start, unitIndex));
    }
    // Write the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        writeDeltaTo(lessThan[ltLength]);
        offset=write(middleUnits[ltLength]);
    }
    return offset;
}